

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

void __thiscall
wabt::WastLexer::WastLexer
          (WastLexer *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source,
          string_view filename)

{
  pointer pLVar1;
  char *pcVar2;
  Offset OVar3;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source_local;
  WastLexer *this_local;
  string_view filename_local;
  
  filename_local.data_ = (char *)filename.size_;
  this_local = (WastLexer *)filename.data_;
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::unique_ptr
            (&this->source_,source);
  string_view::operator_cast_to_string(&this->filename_,(string_view *)&this_local);
  this->line_ = 1;
  pLVar1 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                     (&this->source_);
  pcVar2 = (char *)LexerSource::data(pLVar1);
  this->buffer_ = pcVar2;
  pcVar2 = this->buffer_;
  pLVar1 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                     (&this->source_);
  OVar3 = LexerSource::size(pLVar1);
  this->buffer_end_ = pcVar2 + OVar3;
  this->line_start_ = this->buffer_;
  this->token_start_ = this->buffer_;
  this->cursor_ = this->buffer_;
  return;
}

Assistant:

WastLexer::WastLexer(std::unique_ptr<LexerSource> source, string_view filename)
    : source_(std::move(source)),
      filename_(filename),
      line_(1),
      buffer_(static_cast<const char*>(source_->data())),
      buffer_end_(buffer_ + source_->size()),
      line_start_(buffer_),
      token_start_(buffer_),
      cursor_(buffer_) {}